

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

char * printfTempBuf(sqlite3_str *pAccum,sqlite3_int64 n)

{
  char *z;
  sqlite3_int64 n_local;
  sqlite3_str *pAccum_local;
  
  if (pAccum->accError == '\0') {
    if (((long)(ulong)pAccum->nAlloc < n) && ((long)(ulong)pAccum->mxAlloc < n)) {
      sqlite3StrAccumSetError(pAccum,'\x12');
      pAccum_local = (sqlite3_str *)0x0;
    }
    else {
      pAccum_local = (sqlite3_str *)sqlite3DbMallocRaw(pAccum->db,n);
      if (pAccum_local == (sqlite3_str *)0x0) {
        sqlite3StrAccumSetError(pAccum,'\a');
      }
    }
  }
  else {
    pAccum_local = (sqlite3_str *)0x0;
  }
  return (char *)pAccum_local;
}

Assistant:

static char *printfTempBuf(sqlite3_str *pAccum, sqlite3_int64 n){
  char *z;
  if( pAccum->accError ) return 0;
  if( n>pAccum->nAlloc && n>pAccum->mxAlloc ){
    sqlite3StrAccumSetError(pAccum, SQLITE_TOOBIG);
    return 0;
  }
  z = sqlite3DbMallocRaw(pAccum->db, n);
  if( z==0 ){
    sqlite3StrAccumSetError(pAccum, SQLITE_NOMEM);
  }
  return z;
}